

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

void If_CutFoundFanins_rec(If_Obj_t *pObj,Vec_Int_t *vLeaves)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  iVar1 = pObj->nRefs;
  while ((iVar1 == 0 &&
         (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x2))) {
    If_CutFoundFanins_rec(pObj->pFanin0,vLeaves);
    pObj = pObj->pFanin1;
    iVar1 = pObj->nRefs;
  }
  iVar1 = pObj->Id;
  iVar2 = vLeaves->nSize;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      if (vLeaves->pArray[lVar4] == iVar1) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  if (iVar2 == vLeaves->nCap) {
    if (iVar2 < 0x10) {
      if (vLeaves->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(vLeaves->pArray,0x40);
      }
      vLeaves->pArray = piVar3;
      if (piVar3 == (int *)0x0) {
LAB_0039049b:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vLeaves->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar2 * 2) * 4;
      if (vLeaves->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(__size);
      }
      else {
        piVar3 = (int *)realloc(vLeaves->pArray,__size);
      }
      vLeaves->pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_0039049b;
      vLeaves->nCap = iVar2 * 2;
    }
  }
  else {
    piVar3 = vLeaves->pArray;
  }
  iVar2 = vLeaves->nSize;
  vLeaves->nSize = iVar2 + 1;
  piVar3[iVar2] = iVar1;
  return;
}

Assistant:

void If_CutFoundFanins_rec( If_Obj_t * pObj, Vec_Int_t * vLeaves )
{
    if ( pObj->nRefs || If_ObjIsCi(pObj) )
    {
        Vec_IntPushUnique( vLeaves, pObj->Id );
        return;
    }
    If_CutFoundFanins_rec( If_ObjFanin0(pObj), vLeaves );
    If_CutFoundFanins_rec( If_ObjFanin1(pObj), vLeaves );
}